

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

If_Obj_t * If_ManFanin0Copy(If_Man_t *pIfMan,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  If_Obj_t *pIVar2;
  Gia_Obj_t *pObj_local;
  If_Man_t *pIfMan_local;
  
  pObj_00 = Gia_ObjFanin0(pObj);
  iVar1 = Gia_ObjValue(pObj_00);
  pIVar2 = If_ManObj(pIfMan,iVar1);
  iVar1 = Gia_ObjFaninC0(pObj);
  pIVar2 = If_NotCond(pIVar2,iVar1);
  return pIVar2;
}

Assistant:

static inline If_Obj_t * If_ManFanin0Copy( If_Man_t * pIfMan, Gia_Obj_t * pObj ) { return If_NotCond( If_ManObj(pIfMan, Gia_ObjValue(Gia_ObjFanin0(pObj))), Gia_ObjFaninC0(pObj) ); }